

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflateNoCompression(ucvector *out,uchar *data,size_t datasize)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  size_t pos;
  uint uStack_48;
  uchar firstbyte;
  uint NLEN;
  uint LEN;
  uint BTYPE;
  uint BFINAL;
  uint datapos;
  size_t numdeflateblocks;
  size_t i;
  size_t datasize_local;
  uchar *data_local;
  ucvector *out_local;
  
  uVar3 = (datasize + 0xfffe) / 0xffff;
  BTYPE = 0;
  numdeflateblocks = 0;
  while( true ) {
    if (numdeflateblocks == uVar3) {
      return 0;
    }
    sVar1 = out->size;
    uStack_48 = 0xffff;
    if (datasize - BTYPE < 0xffff) {
      uStack_48 = (int)datasize - BTYPE;
    }
    uVar2 = ucvector_resize(out,out->size + (ulong)uStack_48 + 5);
    if (uVar2 == 0) break;
    out->data[sVar1] = numdeflateblocks == uVar3 - 1;
    out->data[sVar1 + 1] = (uchar)uStack_48;
    out->data[sVar1 + 2] = (uchar)(uStack_48 >> 8);
    out->data[sVar1 + 3] = (uchar)(0xffff - uStack_48);
    out->data[sVar1 + 4] = (uchar)(0xffff - uStack_48 >> 8);
    lodepng_memcpy(out->data + sVar1 + 5,data + BTYPE,(ulong)uStack_48);
    BTYPE = uStack_48 + BTYPE;
    numdeflateblocks = numdeflateblocks + 1;
  }
  return 0x53;
}

Assistant:

static unsigned deflateNoCompression(ucvector* out, const unsigned char* data, size_t datasize) {
  /*non compressed deflate block data: 1 bit BFINAL,2 bits BTYPE,(5 bits): it jumps to start of next byte,
  2 bytes LEN, 2 bytes NLEN, LEN bytes literal DATA*/

  size_t i, numdeflateblocks = (datasize + 65534u) / 65535u;
  unsigned datapos = 0;
  for(i = 0; i != numdeflateblocks; ++i) {
    unsigned BFINAL, BTYPE, LEN, NLEN;
    unsigned char firstbyte;
    size_t pos = out->size;

    BFINAL = (i == numdeflateblocks - 1);
    BTYPE = 0;

    LEN = 65535;
    if(datasize - datapos < 65535u) LEN = (unsigned)datasize - datapos;
    NLEN = 65535 - LEN;

    if(!ucvector_resize(out, out->size + LEN + 5)) return 83; /*alloc fail*/

    firstbyte = (unsigned char)(BFINAL + ((BTYPE & 1u) << 1u) + ((BTYPE & 2u) << 1u));
    out->data[pos + 0] = firstbyte;
    out->data[pos + 1] = (unsigned char)(LEN & 255);
    out->data[pos + 2] = (unsigned char)(LEN >> 8u);
    out->data[pos + 3] = (unsigned char)(NLEN & 255);
    out->data[pos + 4] = (unsigned char)(NLEN >> 8u);
    lodepng_memcpy(out->data + pos + 5, data + datapos, LEN);
    datapos += LEN;
  }

  return 0;
}